

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestTAPAbort::Run(TestTAPAbort *this)

{
  pointer *this_00;
  int iVar1;
  pointer outputter;
  long lVar2;
  bool local_1769;
  string local_1738 [39];
  allocator local_1711;
  undefined1 local_1710 [8];
  Results rs;
  RunParams params;
  string local_16d8 [32];
  undefined1 local_16b8 [8];
  TestAbortInternal myTestB;
  string local_1668 [32];
  undefined1 local_1648 [8];
  TestAbortInternal myTestA;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f8;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15e0 [8];
  ostringstream oss;
  undefined1 local_1468 [8];
  TestRegistry r;
  TestTAPAbort *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::TAPOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTestA.m_runCalled);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::TAPOutputter,std::default_delete<testinator::TAPOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f8,
             (unique_ptr<testinator::TAPOutputter,_std::default_delete<testinator::TAPOutputter>_> *
             )&myTestA.m_runCalled);
  std::unique_ptr<testinator::TAPOutputter,_std::default_delete<testinator::TAPOutputter>_>::
  ~unique_ptr((unique_ptr<testinator::TAPOutputter,_std::default_delete<testinator::TAPOutputter>_>
               *)&myTestA.m_runCalled);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1668,"A",(allocator *)&myTestB.field_0x47);
  TestAbortInternal::TestAbortInternal
            ((TestAbortInternal *)local_1648,(TestRegistry *)local_1468,(string *)local_1668);
  std::__cxx11::string::~string(local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&myTestB.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16d8,"B",(allocator *)((long)&params.m_randomSeed + 7));
  TestAbortInternal::TestAbortInternal
            ((TestAbortInternal *)local_16b8,(TestRegistry *)local_1468,(string *)local_16d8);
  std::__cxx11::string::~string(local_16d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&params.m_randomSeed + 7));
  this_00 = &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  testinator::RunParams::RunParams((RunParams *)this_00);
  rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f8);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1710,(TestRegistry *)local_1468,(RunParams *)this_00,outputter);
  if ((Run()::expected_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Run()::expected_abi_cxx11_,"Bail out! Hello world 42",&local_1711);
    std::allocator<char>::~allocator((allocator<char> *)&local_1711);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected_abi_cxx11_);
  }
  local_1769 = false;
  if (((byte)myTestB.super_Test.m_op & 1) == 0) {
    std::__cxx11::ostringstream::str();
    lVar2 = std::__cxx11::string::find(local_1738,0x2c6bc0);
    local_1769 = lVar2 != -1;
    std::__cxx11::string::~string(local_1738);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1710);
  TestAbortInternal::~TestAbortInternal((TestAbortInternal *)local_16b8);
  TestAbortInternal::~TestAbortInternal((TestAbortInternal *)local_1648);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f8);
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1468);
  return local_1769;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::TAPOutputter>(oss);

    TestAbortInternal myTestA(r, "A");
    TestAbortInternal myTestB(r, "B");
    testinator::RunParams params;
    params.m_flags = testinator::RF_ALPHA_ORDER;
    testinator::Results rs = r.RunAllTests(params, op.get());

    static string expected = "Bail out! Hello world 42";
    return !myTestB.m_runCalled
      && oss.str().find(expected) != string::npos;
  }